

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::
sync_call<void(libtorrent::aux::session_impl::*)(std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)const,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>
          (session_handle *this,offset_in_session_impl_to_subr f,
          vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> **a,
          function<bool_(const_libtorrent::torrent_status_&)> *a_1,
          bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> *a_2)

{
  io_context *ctx;
  undefined8 uVar1;
  undefined4 *in_R9;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::session_impl> s;
  bool local_b9;
  exception_ptr local_b8;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined4 *local_a0;
  exception_ptr local_98;
  undefined1 local_90 [48];
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *local_60;
  function<bool_(const_libtorrent::torrent_status_&)> local_58;
  undefined4 local_38;
  
  local_a0 = in_R9;
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,this);
  if (local_b0._M_ptr == (session_impl *)0x0) {
    local_90._0_4_ = 0x73;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_90);
  }
  local_90._0_8_ = &local_b9;
  local_b9 = false;
  local_90._8_8_ = &local_b8;
  local_b8._M_exception_object = (void *)0x0;
  ctx = (local_b0._M_ptr)->m_io_context;
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)
             (local_90 + 0x10),&local_b0);
  local_60 = *(vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> **)
              &(a_1->super__Function_base)._M_functor;
  local_90._32_8_ = f;
  local_90._40_8_ = a;
  ::std::function<bool_(const_libtorrent::torrent_status_&)>::function
            (&local_58,(function<bool_(const_libtorrent::torrent_status_&)> *)a_2);
  local_38 = *local_a0;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call<void(libtorrent::aux::session_impl::*)(std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)const,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>(void(libtorrent::aux::session_impl::*)(std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)const,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*&&,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&)const::_lambda()_1_>
            (ctx,(type_conflict *)local_90,(type *)0x0);
  const::{lambda()#1}::~sync_call((_lambda___1_ *)local_90);
  aux::torrent_wait(&local_b9,local_b0._M_ptr);
  if (local_b8._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_b8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    return;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_98,&local_b8);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_98);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_98);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_b8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

void session_handle::sync_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;

		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
	}